

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

TopLevelNewFunctionBodyResolveInfo * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL> *this)

{
  TopLevelNewFunctionBodyResolveInfo *pTVar1;
  TopLevelNewFunctionBodyResolveInfo *pTVar2;
  
  pTVar2 = (this->m_inlineHeadBlock).CurrPos;
  pTVar1 = (this->m_inlineHeadBlock).EndPos;
  if ((pTVar2 <= pTVar1) &&
     ((ulong)((long)pTVar2 - (long)(this->m_inlineHeadBlock).BlockData) < 0x3870)) {
    if (pTVar2 == pTVar1) {
      AddArrayLink(this);
      pTVar2 = (this->m_inlineHeadBlock).CurrPos;
    }
    (this->m_inlineHeadBlock).CurrPos = pTVar2 + 1;
    return pTVar2;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }